

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

EGLint eglu::getRenderableAPIsMask(Library *egl,EGLDisplay display)

{
  uint uVar1;
  uint uVar2;
  pointer ppvVar3;
  vector<void_*,_std::allocator<void_*>_> configs;
  _Vector_base<void_*,_std::allocator<void_*>_> local_38;
  
  getConfigs((vector<void_*,_std::allocator<void_*>_> *)&local_38,egl,display);
  uVar2 = 0;
  for (ppvVar3 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppvVar3 != local_38._M_impl.super__Vector_impl_data._M_finish; ppvVar3 = ppvVar3 + 1) {
    uVar1 = getConfigAttribInt(egl,display,*ppvVar3,0x3040);
    uVar2 = uVar2 | uVar1;
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_38);
  return uVar2;
}

Assistant:

EGLint getRenderableAPIsMask (const eglw::Library& egl, eglw::EGLDisplay display)
{
	const vector<EGLConfig>	configs	= getConfigs(egl, display);
	EGLint					allAPIs	= 0;

	for (vector<EGLConfig>::const_iterator i = configs.begin(); i != configs.end(); ++i)
		allAPIs |= getConfigAttribInt(egl, display, *i, EGL_RENDERABLE_TYPE);

	return allAPIs;
}